

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O2

ALLEGRO_BITMAP * create_memory_bitmap(int w,int h)

{
  uint uVar1;
  ALLEGRO_BITMAP *pAVar2;
  
  uVar1 = al_get_new_bitmap_flags();
  al_set_new_bitmap_flags((uVar1 & 0xfffffbfe) + 1);
  pAVar2 = (ALLEGRO_BITMAP *)al_create_bitmap(w,h);
  al_set_new_bitmap_flags(uVar1);
  return pAVar2;
}

Assistant:

ALLEGRO_BITMAP *create_memory_bitmap(int w, int h)
{
   int oldflags;
   int newflags;
   ALLEGRO_BITMAP *bmp;

   oldflags = al_get_new_bitmap_flags();
   newflags = (oldflags &~ ALLEGRO_VIDEO_BITMAP) | ALLEGRO_MEMORY_BITMAP;
   al_set_new_bitmap_flags(newflags);
   bmp = al_create_bitmap(w, h);
   al_set_new_bitmap_flags(oldflags);
   return bmp;
}